

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleDynamicsWorld.cpp
# Opt level: O0

void __thiscall btSimpleDynamicsWorld::synchronizeMotionStates(btSimpleDynamicsWorld *this)

{
  int iVar1;
  btRigidBody *this_00;
  btMotionState *pbVar2;
  btTransform *pbVar3;
  long in_RDI;
  btRigidBody *body;
  btCollisionObject *colObj;
  int i;
  btCollisionObject *in_stack_ffffffffffffffc8;
  int local_c;
  
  for (local_c = 0;
      iVar1 = btAlignedObjectArray<btCollisionObject_*>::size
                        ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8)), local_c < iVar1
      ; local_c = local_c + 1) {
    btAlignedObjectArray<btCollisionObject_*>::operator[]
              ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8),local_c);
    this_00 = btRigidBody::upcast(in_stack_ffffffffffffffc8);
    if (((this_00 != (btRigidBody *)0x0) &&
        (pbVar2 = btRigidBody::getMotionState(this_00), pbVar2 != (btMotionState *)0x0)) &&
       (iVar1 = btCollisionObject::getActivationState(&this_00->super_btCollisionObject), iVar1 != 2
       )) {
      in_stack_ffffffffffffffc8 = (btCollisionObject *)btRigidBody::getMotionState(this_00);
      pbVar3 = btCollisionObject::getWorldTransform(&this_00->super_btCollisionObject);
      (*in_stack_ffffffffffffffc8->_vptr_btCollisionObject[3])(in_stack_ffffffffffffffc8,pbVar3);
    }
  }
  return;
}

Assistant:

void	btSimpleDynamicsWorld::synchronizeMotionStates()
{
	///@todo: iterate over awake simulation islands!
	for ( int i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		btRigidBody* body = btRigidBody::upcast(colObj);
		if (body && body->getMotionState())
		{
			if (body->getActivationState() != ISLAND_SLEEPING)
			{
				body->getMotionState()->setWorldTransform(body->getWorldTransform());
			}
		}
	}

}